

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O0

void __thiscall iDynTree::AttitudeQuaternionEKF::serializeStateVector(AttitudeQuaternionEKF *this)

{
  long lVar1;
  DenseBase<Eigen::Map<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_>_> *in_RDI;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> b;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> Omega;
  Map<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_> q;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> x;
  Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>
  *in_stack_fffffffffffffef0;
  Index in_stack_fffffffffffffef8;
  Index in_stack_ffffffffffffff00;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff08;
  
  toEigen((VectorDynSize *)in_stack_ffffffffffffff08);
  toEigen<4U>((VectorFixSize<4U> *)in_stack_ffffffffffffff08);
  toEigen<3U>((VectorFixSize<3U> *)in_stack_ffffffffffffff08);
  toEigen<3U>((VectorFixSize<3U> *)in_stack_ffffffffffffff08);
  lVar1 = iDynTree::VectorDynSize::size();
  if (lVar1 != *(long *)(in_RDI + 0x3d8)) {
    iDynTree::VectorDynSize::resize((ulong)(in_RDI + 0x378));
  }
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::block<4,1>
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>,4,1,false>::
  operator=((Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_4,_1,_false>
             *)in_stack_fffffffffffffef0,in_RDI);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::block<3,1>
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>,3,1,false>::
  operator=(in_stack_fffffffffffffef0,
            (DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_> *
            )in_RDI);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::block<3,1>
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>,3,1,false>::
  operator=(in_stack_fffffffffffffef0,
            (DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_> *
            )in_RDI);
  return;
}

Assistant:

void iDynTree::AttitudeQuaternionEKF::serializeStateVector()
{
    using iDynTree::toEigen;
    auto x(toEigen(m_x));
    auto q(toEigen(m_state_qekf.m_orientation));
    auto Omega(toEigen(m_state_qekf.m_angular_velocity));
    auto b(toEigen(m_state_qekf.m_gyroscope_bias));

    if (m_x.size() != m_state_size)
    {
        m_x.resize(m_state_size);
    }

    x.block<4, 1>(0, 0) = q;
    x.block<3, 1>(4, 0) = Omega;
    x.block<3, 1>(7, 0) = b;
}